

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O3

SUNMatrix SUNDenseMatrix(sunindextype M,sunindextype N,SUNContext_conflict sunctx)

{
  SUNMatrix_Ops p_Var1;
  SUNMatrix p_Var2;
  sunindextype *psVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  
  p_Var2 = (SUNMatrix)SUNMatNewEmpty(sunctx);
  p_Var1 = p_Var2->ops;
  p_Var1->getid = SUNMatGetID_Dense;
  p_Var1->clone = SUNMatClone_Dense;
  p_Var1->destroy = SUNMatDestroy_Dense;
  p_Var1->zero = SUNMatZero_Dense;
  p_Var1->copy = SUNMatCopy_Dense;
  p_Var1->scaleadd = SUNMatScaleAdd_Dense;
  p_Var1->scaleaddi = SUNMatScaleAddI_Dense;
  p_Var1->matvec = SUNMatMatvec_Dense;
  p_Var1->space = SUNMatSpace_Dense;
  psVar3 = (sunindextype *)malloc(0x28);
  p_Var2->content = psVar3;
  *psVar3 = M;
  psVar3[1] = N;
  psVar3[3] = N * M;
  pvVar4 = calloc(N * M,8);
  psVar3[2] = (sunindextype)pvVar4;
  pvVar4 = malloc(N * 8);
  psVar3[4] = (sunindextype)pvVar4;
  if (0 < N) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      *(sunindextype *)(psVar3[4] + lVar6 * 8) = psVar3[2] + lVar5;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + M * 8;
    } while (N != lVar6);
  }
  return p_Var2;
}

Assistant:

SUNMatrix SUNDenseMatrix(sunindextype M, sunindextype N, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNMatrix A;
  SUNMatrixContent_Dense content;
  sunindextype j;

  /* return with NULL matrix on illegal dimension input */
  SUNAssertNull(N > 0 && M > 0, SUN_ERR_ARG_OUTOFRANGE);

  /* Create an empty matrix object */
  A = NULL;
  A = SUNMatNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  A->ops->getid     = SUNMatGetID_Dense;
  A->ops->clone     = SUNMatClone_Dense;
  A->ops->destroy   = SUNMatDestroy_Dense;
  A->ops->zero      = SUNMatZero_Dense;
  A->ops->copy      = SUNMatCopy_Dense;
  A->ops->scaleadd  = SUNMatScaleAdd_Dense;
  A->ops->scaleaddi = SUNMatScaleAddI_Dense;
  A->ops->matvec    = SUNMatMatvec_Dense;
  A->ops->space     = SUNMatSpace_Dense;

  /* Create content */
  content = NULL;
  content = (SUNMatrixContent_Dense)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  A->content = content;

  /* Fill content */
  content->M     = M;
  content->N     = N;
  content->ldata = M * N;
  content->data  = NULL;
  content->cols  = NULL;

  /* Allocate content */
  content->data = (sunrealtype*)calloc(M * N, sizeof(sunrealtype));
  SUNAssertNull(content->data, SUN_ERR_MALLOC_FAIL);

  content->cols = (sunrealtype**)malloc(N * sizeof(sunrealtype*));
  SUNAssertNull(content->cols, SUN_ERR_MALLOC_FAIL);
  for (j = 0; j < N; j++) { content->cols[j] = content->data + j * M; }

  return (A);
}